

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O3

predict_type
recall_tree_ns::predict_from(recall_tree *b,single_learner *base,example *ec,uint32_t cn)

{
  float fVar1;
  uint32_t uVar2;
  label_t lVar3;
  node *pnVar4;
  uint32_t uVar5;
  uint64_t uVar6;
  node *pnVar7;
  ulong uVar8;
  ulong uVar9;
  
  lVar3 = (ec->l).multi;
  fVar1 = (ec->pred).scalar;
  (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
  (ec->l).simple.initial = 0.0;
  uVar8 = (ulong)cn;
  pnVar7 = (b->nodes)._begin;
  if (pnVar7[uVar8].internal == true) {
    pnVar7 = pnVar7 + uVar8;
    uVar6 = (ec->super_example_predict).ft_offset;
    uVar9 = uVar8;
    uVar5 = cn;
    do {
      uVar2 = pnVar7->base_router;
      (ec->super_example_predict).ft_offset = *(int *)(base + 0xe0) * uVar2 + uVar6;
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      uVar6 = (ec->super_example_predict).ft_offset - (ulong)(uVar2 * *(int *)(base + 0xe0));
      (ec->super_example_predict).ft_offset = uVar6;
      pnVar4 = (b->nodes)._begin;
      cn = (&pnVar4[uVar9].left)[0.0 < ec->partial_prediction || ec->partial_prediction == 0.0];
      uVar8 = (ulong)cn;
      if ((0.0 < b->bern_hyper) && (pnVar4[uVar8].recall_lbest <= pnVar4[uVar9].recall_lbest)) {
        uVar8 = (ulong)uVar5;
        cn = uVar5;
        break;
      }
      pnVar7 = pnVar4 + uVar8;
      uVar9 = uVar8;
      uVar5 = cn;
    } while (pnVar4[uVar8].internal != false);
  }
  (ec->l).multi = lVar3;
  (ec->pred).scalar = fVar1;
  uVar5 = oas_predict(b,base,cn,ec);
  return (predict_type)((ulong)uVar5 << 0x20 | uVar8);
}

Assistant:

predict_type predict_from(recall_tree& b, single_learner& base, example& ec, uint32_t cn)
{
  MULTICLASS::label_t mc = ec.l.multi;
  uint32_t save_pred = ec.pred.multiclass;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  while (b.nodes[cn].internal)
  {
    base.predict(ec, b.nodes[cn].base_router);
    uint32_t newcn = descend(b.nodes[cn], ec.partial_prediction);
    bool cond = stop_recurse_check(b, cn, newcn);

    if (cond)
      break;

    cn = newcn;
  }

  ec.l.multi = mc;
  ec.pred.multiclass = save_pred;

  return predict_type(cn, oas_predict(b, base, cn, ec));
}